

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r6p_2lin.cpp
# Opt level: O1

int R6P2Lin(MatrixXd *X,MatrixXd *u,int direction,double r0,RSDoublelinCameraPoseVector *results)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  void *pvVar7;
  PointerType ptr;
  double *pdVar8;
  undefined8 *puVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  Index IVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  double *pdVar53;
  long lVar54;
  double *pdVar55;
  Index row;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  MatrixXd *pMVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  VectorXd Ct;
  VectorXd p;
  vector<double,_std::allocator<double>_> v1;
  MatrixXd g;
  MatrixXd H;
  vector<double,_std::allocator<double>_> w3;
  vector<double,_std::allocator<double>_> w2;
  vector<double,_std::allocator<double>_> w1;
  vector<double,_std::allocator<double>_> v3;
  vector<double,_std::allocator<double>_> v2;
  MatrixXd Helimtr;
  VectorXd x;
  MatrixXd A;
  list<int,_std::allocator<int>_> b;
  MatrixXd Helim;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_3b8;
  double local_3a0;
  int local_394;
  double *local_390;
  double *local_388;
  double *local_380;
  double *local_378;
  double *local_370;
  double *local_368;
  double *local_360;
  double *local_358;
  double *local_350;
  double *local_348;
  double *local_340;
  double *local_338;
  double *local_330;
  double *local_328;
  double *local_320;
  double *local_318;
  double *local_310;
  double *local_308;
  double *local_300;
  double local_2f8;
  undefined8 uStack_2f0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_2e8;
  double local_2d8;
  undefined8 uStack_2d0;
  double local_2c8;
  undefined8 uStack_2c0;
  vector<double,_std::allocator<double>_> local_2b8;
  DenseStorage<double,__1,__1,__1,_0> local_298;
  double local_278;
  undefined8 uStack_270;
  double local_268;
  undefined8 uStack_260;
  double local_258;
  undefined8 uStack_250;
  undefined1 local_248 [16];
  double *local_238;
  double *local_230;
  double *local_228;
  double *local_220;
  double *local_218;
  double *local_210;
  void *local_208;
  ulong local_200;
  DenseStorage<double,__1,__1,__1,_0> local_1f8;
  double local_1d8;
  undefined8 uStack_1d0;
  vector<double,_std::allocator<double>_> local_1c8;
  vector<double,_std::allocator<double>_> local_1a8;
  vector<double,_std::allocator<double>_> local_188;
  vector<double,_std::allocator<double>_> local_168;
  vector<double,_std::allocator<double>_> local_148;
  void *local_130;
  double local_128;
  MatrixXd *local_118;
  undefined8 uStack_110;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_108;
  RSDoublelinCameraPoseVector *local_f0;
  RSDoublelinCameraPose local_e8;
  DenseStorage<double,__1,__1,__1,_0> local_78;
  _List_node_base local_60;
  undefined8 local_50;
  MatrixXd local_48;
  
  local_248._8_8_ = local_248._0_8_;
  local_1f8.m_data = (double *)0x0;
  local_1f8.m_rows = 0;
  local_1f8.m_cols = 0;
  local_3a0 = r0;
  local_394 = direction;
  local_118 = u;
  local_f0 = results;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1f8,0x108,0xc,0x16);
  pdVar8 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data +
           2;
  lVar51 = 0;
  uVar38 = (ulong)(local_1f8.m_cols == 1);
  IVar43 = local_1f8.m_rows;
  if (local_1f8.m_cols == 1) {
    IVar43 = lVar51;
  }
  lVar44 = 2 - uVar38;
  uVar39 = uVar38;
  if (lVar44 == local_1f8.m_cols) {
    lVar44 = lVar51;
    uVar39 = uVar38 + 1;
  }
  lVar42 = lVar44 + 1;
  lVar12 = lVar42;
  if (lVar42 == local_1f8.m_cols) {
    lVar12 = lVar51;
  }
  lVar45 = (lVar42 == local_1f8.m_cols) + uVar39;
  lVar13 = lVar12 + 1;
  lVar42 = lVar13;
  if (lVar13 == local_1f8.m_cols) {
    lVar42 = lVar51;
  }
  lVar48 = (ulong)(lVar13 == local_1f8.m_cols) + lVar45;
  lVar14 = lVar42 + 1;
  lVar13 = lVar14;
  if (lVar14 == local_1f8.m_cols) {
    lVar13 = lVar51;
  }
  lVar46 = (ulong)(lVar14 == local_1f8.m_cols) + lVar48;
  lVar15 = lVar13 + 1;
  lVar14 = lVar15;
  if (lVar15 == local_1f8.m_cols) {
    lVar14 = lVar51;
  }
  lVar49 = (ulong)(lVar15 == local_1f8.m_cols) + lVar46;
  lVar16 = lVar14 + 1;
  lVar15 = lVar16;
  if (lVar16 == local_1f8.m_cols) {
    lVar15 = lVar51;
  }
  local_1d8 = (double)((ulong)(lVar16 == local_1f8.m_cols) + lVar49);
  lVar17 = lVar15 + 1;
  lVar16 = lVar17;
  if (lVar17 == local_1f8.m_cols) {
    lVar16 = lVar51;
  }
  lVar18 = lVar16 + 1;
  lVar19 = lVar18;
  if (lVar18 == local_1f8.m_cols) {
    lVar19 = lVar51;
  }
  lVar20 = lVar19 + 1;
  lVar21 = lVar20;
  if (lVar20 == local_1f8.m_cols) {
    lVar21 = lVar51;
  }
  lVar22 = lVar21 + 1;
  lVar23 = lVar22;
  if (lVar22 == local_1f8.m_cols) {
    lVar23 = lVar51;
  }
  lVar24 = lVar23 + 1;
  lVar25 = lVar24;
  if (lVar24 == local_1f8.m_cols) {
    lVar25 = lVar51;
  }
  lVar26 = lVar25 + 1;
  lVar27 = lVar26;
  if (lVar26 == local_1f8.m_cols) {
    lVar27 = lVar51;
  }
  lVar28 = lVar27 + 1;
  lVar29 = lVar28;
  if (lVar28 == local_1f8.m_cols) {
    lVar29 = lVar51;
  }
  lVar30 = lVar29 + 1;
  lVar31 = lVar30;
  if (lVar30 == local_1f8.m_cols) {
    lVar31 = lVar51;
  }
  lVar32 = lVar31 + 1;
  lVar33 = lVar32;
  if (lVar32 == local_1f8.m_cols) {
    lVar33 = lVar51;
  }
  lVar37 = lVar33 + 1;
  lVar41 = lVar37;
  if (lVar37 == local_1f8.m_cols) {
    lVar41 = lVar51;
  }
  lVar40 = lVar41 + 1;
  lVar60 = lVar40;
  if (lVar40 == local_1f8.m_cols) {
    lVar60 = lVar51;
  }
  lVar50 = lVar60 + 1;
  lVar57 = lVar50;
  if (lVar50 == local_1f8.m_cols) {
    lVar57 = lVar51;
  }
  lVar1 = lVar57 + 1;
  lVar54 = lVar1;
  if (lVar1 == local_1f8.m_cols) {
    lVar54 = lVar51;
  }
  lVar10 = lVar54 + 1;
  lVar47 = lVar10;
  if (lVar10 == local_1f8.m_cols) {
    lVar47 = lVar51;
  }
  uVar34 = (ulong)(lVar10 == local_1f8.m_cols);
  lVar35 = (ulong)(lVar17 == local_1f8.m_cols) + (long)local_1d8;
  lVar10 = (ulong)(lVar18 == local_1f8.m_cols) + lVar35;
  lVar36 = (ulong)(lVar20 == local_1f8.m_cols) + lVar10;
  local_248._0_8_ = (ulong)(lVar22 == local_1f8.m_cols) + lVar36;
  local_258 = (double)((ulong)(lVar24 == local_1f8.m_cols) + local_248._0_8_);
  local_268 = (double)((ulong)(lVar26 == local_1f8.m_cols) + (long)local_258);
  local_278 = (double)((ulong)(lVar28 == local_1f8.m_cols) + (long)local_268);
  lVar52 = (ulong)(lVar30 == local_1f8.m_cols) + (long)local_278;
  lVar59 = (ulong)(lVar32 == local_1f8.m_cols) + lVar52;
  lVar58 = (ulong)(lVar37 == local_1f8.m_cols) + lVar59;
  lVar40 = (ulong)(lVar40 == local_1f8.m_cols) + lVar58;
  lVar56 = (ulong)(lVar50 == local_1f8.m_cols) + lVar40;
  lVar50 = (ulong)(lVar1 == local_1f8.m_cols) + lVar56;
  lVar51 = lVar50 * 8 + lVar47 * local_1f8.m_rows * 8 + uVar34 * 8;
  lVar17 = lVar50 * 8 + lVar54 * local_1f8.m_rows * 8;
  lVar37 = lVar33 * local_1f8.m_rows * 8 + lVar59 * 8;
  lVar18 = lVar52 * 8 + lVar31 * local_1f8.m_rows * 8;
  lVar20 = (long)local_278 * 8 + lVar29 * local_1f8.m_rows * 8;
  lVar22 = (long)local_268 * 8 + lVar27 * local_1f8.m_rows * 8;
  lVar24 = (long)local_258 * 8 + lVar25 * local_1f8.m_rows * 8;
  lVar26 = local_248._0_8_ * 8 + lVar23 * local_1f8.m_rows * 8;
  lVar28 = (long)local_1d8 * 8 + lVar15 * local_1f8.m_rows * 8;
  lVar30 = lVar46 * 8 + lVar13 * local_1f8.m_rows * 8;
  lVar32 = lVar48 * 8 + lVar42 * local_1f8.m_rows * 8;
  lVar12 = lVar45 * 8 + lVar12 * local_1f8.m_rows * 8;
  lVar44 = uVar39 * 8 + lVar44 * local_1f8.m_rows * 8;
  lVar45 = uVar38 * 8 + IVar43 * 8;
  pdVar53 = (local_118->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_data;
  local_338 = local_1f8.m_data + uVar34 + lVar47 * local_1f8.m_rows + lVar50 + 1;
  local_340 = local_1f8.m_data + lVar54 * local_1f8.m_rows + lVar50 + 1;
  local_348 = local_1f8.m_data + lVar57 * local_1f8.m_rows + lVar56 + 1;
  local_300 = local_1f8.m_data + lVar57 * local_1f8.m_rows + lVar56;
  local_350 = local_1f8.m_data + lVar60 * local_1f8.m_rows + lVar40 + 1;
  local_308 = local_1f8.m_data + lVar60 * local_1f8.m_rows + lVar40;
  local_358 = local_1f8.m_data + lVar41 * local_1f8.m_rows + lVar58 + 1;
  local_310 = local_1f8.m_data + lVar41 * local_1f8.m_rows + lVar58;
  local_360 = local_1f8.m_data + lVar59 + lVar33 * local_1f8.m_rows + 1;
  local_368 = local_1f8.m_data + lVar31 * local_1f8.m_rows + lVar52 + 1;
  local_370 = local_1f8.m_data + lVar29 * local_1f8.m_rows + (long)local_278 + 1;
  local_378 = local_1f8.m_data + lVar27 * local_1f8.m_rows + (long)local_268 + 1;
  local_380 = local_1f8.m_data + lVar25 * local_1f8.m_rows + (long)local_258 + 1;
  local_388 = local_1f8.m_data + lVar23 * local_1f8.m_rows + local_248._0_8_ + 1;
  local_390 = local_1f8.m_data + lVar21 * local_1f8.m_rows + lVar36 + 1;
  local_318 = local_1f8.m_data + lVar21 * local_1f8.m_rows + lVar36;
  local_210 = local_1f8.m_data + lVar19 * local_1f8.m_rows + lVar10 + 1;
  local_320 = local_1f8.m_data + lVar19 * local_1f8.m_rows + lVar10;
  local_218 = local_1f8.m_data + lVar16 * local_1f8.m_rows + lVar35 + 1;
  local_328 = local_1f8.m_data + lVar16 * local_1f8.m_rows + lVar35;
  local_220 = local_1f8.m_data + lVar15 * local_1f8.m_rows + (long)local_1d8 + 1;
  local_228 = local_1f8.m_data + lVar14 * local_1f8.m_rows + lVar49 + 1;
  local_330 = local_1f8.m_data + lVar14 * local_1f8.m_rows + lVar49;
  local_230 = local_1f8.m_data + lVar13 * local_1f8.m_rows + lVar46 + 1;
  local_238 = local_1f8.m_data + lVar42 * local_1f8.m_rows + lVar48 + 1;
  lVar42 = 0;
  do {
    local_2f8 = pdVar8[-2];
    local_2d8 = pdVar8[-1];
    dVar2 = *pdVar8;
    dVar3 = *(double *)((long)pdVar53 + lVar42);
    dVar4 = *(double *)((long)pdVar53 + lVar42 + 8);
    dVar65 = -dVar4;
    local_2c8 = local_2d8 * local_3a0;
    uStack_2c0 = 0;
    dVar66 = -local_2c8;
    pMVar64 = (MatrixXd *)(dVar2 * dVar4);
    uStack_2d0 = 0;
    if (local_394 == 0) {
      *(undefined8 *)((long)local_1f8.m_data + lVar42) = 0;
      *(undefined8 *)((long)local_1f8.m_data + lVar42 + lVar45) = 0xbff0000000000000;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar44) = dVar4;
      *(undefined8 *)((long)local_1f8.m_data + lVar42 + lVar12) = 0;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar32) = local_3a0 - dVar3;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar30) = dVar4 * dVar3 + dVar65 * local_3a0;
      dVar66 = local_2d8 * dVar3 + dVar66;
      dVar61 = -(double)pMVar64 * dVar3;
      *(double *)((long)local_330 + lVar42) = dVar61 + dVar66 + (double)pMVar64 * local_3a0;
      *(undefined8 *)((long)local_1f8.m_data + lVar42 + lVar28) = 0;
      *(undefined8 *)((long)local_328 + lVar42) = 0;
      dVar68 = -local_2f8;
      dVar65 = local_2f8 * local_3a0 + dVar3 * dVar68;
      *(double *)((long)local_320 + lVar42) = dVar65;
      *(double *)((long)local_318 + lVar42) = (double)pMVar64 * local_3a0 + dVar61;
      dVar62 = dVar2 * dVar3;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar26) = dVar2 * local_3a0 - dVar62;
      dVar61 = local_2f8 * dVar4 * dVar3;
      dVar69 = local_2f8 * dVar4 * local_3a0;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar24) = dVar61 - dVar69;
      dVar67 = local_2d8 * dVar4;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar22) = dVar67 * dVar3 + -dVar67 * local_3a0;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar20) = dVar66;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar18) = dVar67 + dVar2;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar37) = dVar4 * dVar68;
      *(double *)((long)local_310 + lVar42) = dVar68;
      dVar63 = dVar62 + -dVar2 * local_3a0;
      *(double *)((long)local_308 + lVar42) = dVar67 * dVar3 + dVar63 + -dVar67 * local_3a0;
      *(double *)((long)local_300 + lVar42) = dVar69 - dVar61;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar17) = dVar65;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar51) = (double)pMVar64 - local_2d8;
      *(undefined8 *)((long)local_1f8.m_data + lVar42 + 8) = 0x3ff0000000000000;
      *(undefined8 *)((long)local_1f8.m_data + lVar42 + lVar45 + 8) = 0;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar44 + 8) = -dVar3;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar12 + 8) = dVar3 - local_3a0;
      *(undefined8 *)((long)local_238 + lVar42) = 0;
      *(double *)((long)local_230 + lVar42) = dVar3 * local_3a0 - dVar3 * dVar3;
      *(double *)((long)local_228 + lVar42) = -dVar2 * local_3a0 * dVar3 + dVar62 * dVar3;
      *(double *)((long)local_220 + lVar42) = dVar66;
      *(double *)((long)local_218 + lVar42) = dVar63;
      *(undefined8 *)((long)local_210 + lVar42) = 0;
      *(double *)((long)local_390 + lVar42) = (dVar62 * dVar3 + dVar65) - dVar62 * local_3a0;
      *(undefined8 *)((long)local_388 + lVar42) = 0;
      *(double *)((long)local_380 + lVar42) = dVar3 * dVar68 * dVar3 + local_2f8 * local_3a0 * dVar3
      ;
      dVar4 = dVar3 * -local_2d8;
      dVar66 = dVar4 * dVar3 + local_2c8 * dVar3;
      *(double *)((long)local_378 + lVar42) = dVar66;
      *(double *)((long)local_370 + lVar42) = dVar65;
      *(double *)((long)local_368 + lVar42) = dVar4;
      dVar65 = local_2f8 * dVar3;
      *(double *)((long)local_360 + lVar42) = dVar2 + dVar65;
      *(double *)((long)local_358 + lVar42) = -local_2d8;
      *(double *)((long)local_350 + lVar42) = dVar66;
      *(double *)((long)local_348 + lVar42) = (dVar3 * dVar65 + dVar63) - dVar65 * local_3a0;
      *(double *)((long)local_340 + lVar42) = dVar4 + local_2c8;
      *(double *)((long)local_338 + lVar42) = local_2f8 - dVar62;
    }
    else {
      *(undefined8 *)((long)local_1f8.m_data + lVar42) = 0;
      *(undefined8 *)((long)local_1f8.m_data + lVar42 + lVar45) = 0xbff0000000000000;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar44) = dVar4;
      *(undefined8 *)((long)local_1f8.m_data + lVar42 + lVar12) = 0;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar32) = local_3a0 - dVar4;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar30) = dVar4 * dVar4 + dVar65 * local_3a0;
      dVar63 = local_2d8 * dVar4;
      *(double *)((long)local_330 + lVar42) =
           (double)pMVar64 * local_3a0 + -(double)pMVar64 * dVar4 + dVar63 + dVar66;
      *(undefined8 *)((long)local_1f8.m_data + lVar42 + lVar28) = 0;
      *(undefined8 *)((long)local_328 + lVar42) = 0;
      dVar61 = -dVar2;
      local_248._8_4_ = 0;
      local_248._0_8_ = dVar61;
      local_248._12_4_ = 0x80000000;
      dVar67 = dVar4 * dVar61;
      dVar68 = dVar2 * local_3a0;
      local_258 = dVar67 * dVar4 + dVar68 * dVar4;
      uStack_250 = 0;
      dVar71 = dVar4 * -local_2f8;
      dVar69 = local_2f8 * local_3a0;
      local_278 = dVar69 + dVar71;
      uStack_270 = 0;
      *(double *)((long)local_320 + lVar42) = local_278;
      *(double *)((long)local_318 + lVar42) = local_258;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar26) = dVar68 + dVar67;
      dVar62 = local_2f8 * dVar4;
      local_1d8 = dVar69 * dVar4;
      uStack_110 = 0;
      uStack_1d0 = 0;
      local_268 = dVar62 * dVar4 - local_1d8;
      uStack_260 = 0;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar24) = local_268;
      dVar70 = dVar63 * dVar4;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar22) = dVar66 * dVar4 + dVar70;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar20) = dVar63 + dVar66;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar18) = dVar2 + dVar63;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar37) = dVar71;
      *(double *)((long)local_310 + lVar42) = -local_2f8;
      local_2f8 = local_2f8 * dVar3 + dVar63;
      *(double *)((long)local_308 + lVar42) =
           ((double)pMVar64 - dVar68) + dVar70 + -dVar63 * local_3a0;
      *(double *)((long)local_300 + lVar42) = dVar71 * dVar4 + local_1d8;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar17) = local_278;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar51) = (double)pMVar64 - local_2d8;
      *(double *)((long)local_1f8.m_data + lVar42 + 8) = dVar65;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar45 + 8) = dVar3;
      *(undefined8 *)((long)local_1f8.m_data + lVar42 + lVar44 + 8) = 0;
      *(double *)((long)local_1f8.m_data + lVar42 + lVar12 + 8) = dVar65 * dVar4 + dVar4 * local_3a0
      ;
      *(double *)((long)local_238 + lVar42) = dVar4 * dVar3 - dVar3 * local_3a0;
      dVar2 = dVar3 * -local_2d8 * dVar4;
      *(undefined8 *)((long)local_230 + lVar42) = 0;
      *(double *)((long)local_228 + lVar42) = local_2c8 * dVar3 + dVar2;
      *(double *)((long)local_220 + lVar42) = -local_2d8 * dVar4 * dVar4 + local_2c8 * dVar4;
      *(double *)((long)local_218 + lVar42) = local_258;
      *(double *)((long)local_210 + lVar42) = dVar62 * dVar3 - dVar69 * dVar3;
      *(double *)((long)local_390 + lVar42) = local_268;
      *(double *)((long)local_388 + lVar42) = (double)pMVar64 * dVar3 - dVar68 * dVar3;
      *(undefined8 *)((long)local_380 + lVar42) = 0;
      *(undefined8 *)((long)local_378 + lVar42) = 0;
      *(double *)((long)local_370 + lVar42) =
           (dVar62 * dVar4 - dVar62 * local_3a0) + dVar2 + local_2c8 * dVar3;
      *(double *)((long)local_368 + lVar42) = dVar61 * dVar3;
      *(double *)((long)local_360 + lVar42) = dVar67;
      *(double *)((long)local_358 + lVar42) = local_2f8;
      *(double *)((long)local_350 + lVar42) = dVar67 * dVar3 + dVar68 * dVar3;
      *(double *)((long)local_348 + lVar42) = local_258;
      *(double *)((long)local_340 + lVar42) =
           (-dVar63 * local_3a0 + dVar70 + dVar62 * dVar3) - dVar69 * dVar3;
      *(double *)((long)local_338 + lVar42) = local_2d8 * dVar3 + dVar71;
      local_118 = pMVar64;
    }
    uStack_2f0 = 0;
    pdVar8 = pdVar8 + 3;
    lVar42 = lVar42 + 0x10;
  } while (lVar42 != 0x60);
  local_e8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_1f8;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_48,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_e8);
  local_60._M_next = &local_60;
  local_50 = 0;
  local_60._M_prev = local_60._M_next;
  colEchelonForm(&local_48,(list<int,_std::allocator<int>_> *)local_60._M_next);
  local_e8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_48;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_130,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_e8);
  dVar2 = local_128;
  pvVar7 = local_130;
  local_298.m_cols = 0;
  local_298.m_data = (double *)0x0;
  local_298.m_rows = 0;
  local_2e8.m_storage.m_data = (double *)0x0;
  local_2e8.m_storage.m_rows = 0;
  local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_298,0x3c,10,6);
  pdVar8 = local_298.m_data;
  if (0 < local_298.m_cols) {
    pdVar11 = (double *)((long)pvVar7 + (long)dVar2 * 0x60 + 0x30);
    lVar51 = 0;
    pdVar53 = local_298.m_data;
    do {
      if (0 < local_298.m_rows) {
        lVar44 = 0;
        pdVar55 = pdVar11;
        do {
          pdVar53[lVar44] = *pdVar55;
          lVar44 = lVar44 + 1;
          pdVar55 = pdVar55 + (long)dVar2;
        } while (local_298.m_rows != lVar44);
      }
      lVar51 = lVar51 + 1;
      pdVar11 = pdVar11 + 1;
      pdVar53 = pdVar53 + local_298.m_rows;
    } while (lVar51 != local_298.m_cols);
  }
  if (local_2e8.m_storage.m_rows != 0x3c) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_2e8,0x3c,1);
  }
  uVar38 = local_2e8.m_storage.m_rows - (local_2e8.m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
  if (1 < local_2e8.m_storage.m_rows) {
    lVar51 = 0;
    do {
      pdVar53 = pdVar8 + lVar51;
      dVar2 = pdVar53[1];
      local_2e8.m_storage.m_data[lVar51] = *pdVar53;
      (local_2e8.m_storage.m_data + lVar51)[1] = dVar2;
      lVar51 = lVar51 + 2;
    } while (lVar51 < (long)uVar38);
  }
  if ((long)uVar38 < local_2e8.m_storage.m_rows) {
    do {
      local_2e8.m_storage.m_data[uVar38] = pdVar8[uVar38];
      uVar38 = uVar38 + 1;
    } while (local_2e8.m_storage.m_rows != uVar38);
  }
  solveVW3var(local_2e8.m_storage.m_data,&local_2b8,&local_148,&local_168,&local_188,&local_1a8,
              &local_1c8);
  local_108.m_storage.m_data = (double *)0x0;
  local_108.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_108,0x10,1);
  local_e8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)((long)local_128 * 0x30 + (long)local_130);
  local_e8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 2.96439387504748e-323;
  local_e8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 7.90505033345994e-323;
  local_e8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_e8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 2.96439387504748e-323;
  local_e8.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = local_128;
  local_78.m_data = (double *)0x0;
  local_78.m_rows = 0;
  local_78.m_cols = 0;
  local_e8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_130;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_78,0x60,6,0x10);
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_78,
             (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&local_e8,
             (assign_op<double,_double> *)&local_208);
  local_3b8.m_storage.m_data = (double *)0x0;
  local_3b8.m_storage.m_rows = 0;
  free((void *)0x0);
  pdVar8 = (double *)malloc(0x30);
  if (pdVar8 == (double *)0x0) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar9 = std::ostream::_M_insert<long>;
    __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_3b8.m_storage.m_rows = 6;
  local_3b8.m_storage.m_data = pdVar8;
  if (local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar38 = 0;
    do {
      *local_108.m_storage.m_data =
           local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38] *
           local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38];
      local_108.m_storage.m_data[1] =
           local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38] *
           local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38];
      local_108.m_storage.m_data[2] =
           local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38] *
           local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38];
      local_108.m_storage.m_data[3] =
           local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38] *
           local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38];
      local_108.m_storage.m_data[4] =
           local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38] *
           local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38];
      local_108.m_storage.m_data[5] =
           local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38] *
           local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38];
      local_108.m_storage.m_data[6] =
           local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38] *
           local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38];
      local_108.m_storage.m_data[7] =
           local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38] *
           local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38];
      local_108.m_storage.m_data[8] =
           local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38] *
           local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38];
      local_108.m_storage.m_data[9] =
           local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38];
      local_108.m_storage.m_data[10] =
           local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38];
      local_108.m_storage.m_data[0xb] =
           local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38];
      local_108.m_storage.m_data[0xc] =
           local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38];
      local_108.m_storage.m_data[0xd] =
           local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38];
      local_108.m_storage.m_data[0xe] =
           local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38];
      local_108.m_storage.m_data[0xf] = 1.0;
      local_e8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (double)&local_78;
      local_e8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = (double)&local_108;
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((Matrix<double,_1,1,0,_1,1> *)&local_208,
                 (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                  *)&local_e8);
      pvVar7 = local_208;
      if (local_3b8.m_storage.m_rows != local_200) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_3b8,local_200,1);
      }
      uVar39 = local_3b8.m_storage.m_rows - (local_3b8.m_storage.m_rows >> 0x3f) &
               0xfffffffffffffffe;
      if (1 < local_3b8.m_storage.m_rows) {
        lVar51 = 0;
        do {
          pdVar8 = (double *)((long)pvVar7 + lVar51 * 8);
          dVar2 = pdVar8[1];
          local_3b8.m_storage.m_data[lVar51] = *pdVar8;
          (local_3b8.m_storage.m_data + lVar51)[1] = dVar2;
          lVar51 = lVar51 + 2;
        } while (lVar51 < (long)uVar39);
      }
      if ((long)uVar39 < local_3b8.m_storage.m_rows) {
        do {
          local_3b8.m_storage.m_data[uVar39] = *(double *)((long)pvVar7 + uVar39 * 8);
          uVar39 = uVar39 + 1;
        } while (local_3b8.m_storage.m_rows != uVar39);
      }
      free(local_208);
      local_e8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar38];
      local_e8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar38];
      local_e8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar38];
      local_e8.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar38];
      local_e8.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar38];
      local_e8.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar38];
      local_e8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = *local_3b8.m_storage.m_data;
      local_e8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = local_3b8.m_storage.m_data[1];
      local_e8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = local_3b8.m_storage.m_data[2];
      local_e8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = local_3b8.m_storage.m_data[3];
      local_e8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = local_3b8.m_storage.m_data[4];
      local_e8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = local_3b8.m_storage.m_data[5];
      local_e8.f = 1.0;
      local_e8.rd = 0.0;
      std::vector<RSDoublelinCameraPose,_std::allocator<RSDoublelinCameraPose>_>::
      emplace_back<RSDoublelinCameraPose>(local_f0,&local_e8);
      uVar38 = uVar38 + 1;
    } while (uVar38 < (ulong)((long)local_2b8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_2b8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  free(local_3b8.m_storage.m_data);
  free(local_78.m_data);
  free(local_108.m_storage.m_data);
  if (local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  free(local_2e8.m_storage.m_data);
  free(local_298.m_data);
  free(local_130);
  p_Var6 = local_60._M_next;
  while (p_Var6 != &local_60) {
    p_Var5 = (((_List_base<int,_std::allocator<int>_> *)&p_Var6->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var6);
    p_Var6 = p_Var5;
  }
  free(local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_1f8.m_data);
  return 0;
}

Assistant:

int R6P2Lin(const Eigen::MatrixXd & X, const Eigen::MatrixXd & u, int direction, double r0, RSDoublelinCameraPoseVector * results){
	Eigen::MatrixXd H(12, 22);
	double X_1, X_2, X_3, r, c, c0;
	bool planar = false;
	if (direction!=0){
		c0 = r0;
	}
	

	for (int i = 0; i < 6; i++)
	{
		X_1 = X(i * 3);
		X_2 = X(i * 3 + 1);
		X_3 = X(i * 3 + 2);
		r = u(i * 2);
		c = u(i * 2 + 1);

		if (direction == 0){
			H.row(i * 2) << 0, -1, c, 0, r0 - r, c*r - c*r0, X_2*r - X_2*r0 - X_3*c*r + X_3*c*r0, 0, 0, X_1*r0 - X_1*r, X_3*c*r0 - X_3*c*r, X_3*r0 - X_3*r, X_1*c*r - X_1*c*r0, X_2*c*r - X_2*c*r0, X_2*r - X_2*r0, X_3 + X_2*c, -X_1*c, -X_1, X_3*r - X_3*r0 + X_2*c*r - X_2*c*r0, X_1*c*r0 - X_1*c*r, X_1*r0 - X_1*r, X_3*c - X_2;
			H.row(i * 2 + 1) << 1, 0, -r, r - r0, 0, -r*r + r0*r, X_3*r*r - X_3*r0*r, X_2*r - X_2*r0, X_3*r - X_3*r0, 0, X_1*r0 - X_1*r + X_3*r*r - X_3*r*r0, 0, -X_1*r*r + X_1*r0*r, -X_2*r*r + X_2*r0*r, X_1*r0 - X_1*r, -X_2*r, X_3 + X_1*r, -X_2, -X_2*r*r + X_2*r0*r, X_3*r - X_3*r0 + X_1*r*r - X_1*r*r0, X_2*r0 - X_2*r, X_1 - X_3*r;
		}
		else{
			H.row(i * 2) << 0, -1, c, 0, c0 - c, c*c - c0*c, X_2*c - X_2*c0 - X_3*c*c + X_3*c*c0, 0, 0, X_1*c0 - X_1*c, -X_3*c*c + X_3*c0*c, X_3*c0 - X_3*c, X_1*c*c - X_1*c0*c, X_2*c*c - X_2*c0*c, X_2*c - X_2*c0, X_3 + X_2*c, -X_1*c, -X_1, X_3*c - X_3*c0 + X_2*c*c - X_2*c*c0, -X_1*c*c + X_1*c0*c, X_1*c0 - X_1*c, X_3*c - X_2;
			H.row(i * 2 + 1) << -c, r, 0, -c*c + c0*c, c*r - c0*r, 0, X_2*c0*r - X_2*c*r, -X_2*c*c + X_2*c0*c, -X_3*c*c+ X_3*c0*c, X_1*c*r - X_1*c0*r, X_1*c*c - X_1*c0*c, X_3*c*r - X_3*c0*r, 0, 0, X_1*c*c - X_1*c*c0 - X_2*c*r + X_2*c0*r, -X_3*r, -X_3*c, X_2*c + X_1*r, X_3*c0*r - X_3*c*r, -X_3*c*c + X_3*c0*c, X_2*c*c - X_2*c*c0 + X_1*c*r - X_1*c0*r, X_2*r - X_1*c;
		}
	}
	
	Eigen::MatrixXd Helim = H.transpose();
	std::list<int> b;
	colEchelonForm(Helim, b);

	Eigen::MatrixXd Helimtr = Helim.transpose();
	
	Eigen::MatrixXd g; 
	Eigen::VectorXd p;
	std::vector<double> v1, v2, v3, w1, w2, w3;
	
    g = Helimtr.block(6, 12, 6, 10).transpose();
    p = Eigen::Map<Eigen::VectorXd>(g.data(), 6 * 10);
    solveVW3var(p.data(), v1, v2, v3, w1, w2, w3);
	
	Eigen::VectorXd x(16,1);
	Eigen::MatrixXd A = Helimtr.block(0,6,6,16);
	Eigen::VectorXd Ct(6);
	Eigen::Vector3d Cres;

	for (int i = 0; i < v1.size(); i++)
	{
		x << v1[i]*w1[i], v1[i]*w2[i], v1[i]*w3[i], v2[i]*w1[i], v2[i]*w2[i], v2[i]*w3[i], v3[i]*w1[i], v3[i]*w2[i], v3[i]*w3[i], v1[i], v2[i], v3[i], w1[i], w2[i], w3[i], 1;
		Ct = -A*x;
		Eigen::Vector3d vr, wr;
		vr << v1[i], v2[i], v3[i];
		wr << w1[i], w2[i], w3[i];
		results->push_back({vr, Ct.segment(0, 3), wr, Ct.segment(3, 3), 1, 0});
	}

    return 0;
}